

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ClockingItemSyntax::ClockingItemSyntax
          (ClockingItemSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          ClockingDirectionSyntax *direction,
          SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *decls,Token semi)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  ClockingDirectionSyntax *pCVar4;
  AttributeSpecSyntax *pAVar5;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *__range2;
  undefined8 uVar6;
  iterator __begin2;
  
  uVar6 = semi._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,ClockingItem,attributes);
  __begin2.list = (ParentList *)direction;
  not_null<slang::syntax::ClockingDirectionSyntax*>::
  not_null<slang::syntax::ClockingDirectionSyntax*,void>
            ((not_null<slang::syntax::ClockingDirectionSyntax*> *)&this->direction,
             (ClockingDirectionSyntax **)&__begin2);
  SVar2 = (decls->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(decls->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->decls).super_SyntaxListBase.super_SyntaxNode.parent =
       (decls->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->decls).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->decls).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->decls).super_SyntaxListBase.childCount = (decls->super_SyntaxListBase).childCount;
  (this->decls).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00472e00;
  sVar1 = (decls->elements).size_;
  (this->decls).elements.data_ = (decls->elements).data_;
  (this->decls).elements.size_ = sVar1;
  (this->semi).kind = (short)uVar6;
  (this->semi).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->semi).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->semi).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->semi).info = semi.info;
  pCVar4 = not_null<slang::syntax::ClockingDirectionSyntax_*>::get(&this->direction);
  (pCVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->decls).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __begin2.index = 0;
  sVar1 = (this->decls).elements.size_;
  __begin2.list = &this->decls;
  for (; (__begin2.list != &this->decls || (__begin2.index != sVar1 + 1 >> 1));
      __begin2.index = __begin2.index + 1) {
    pAVar5 = SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::
             iterator_base<slang::syntax::AttributeSpecSyntax_*>::operator*(&__begin2);
    (pAVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ClockingItemSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, ClockingDirectionSyntax& direction, const SeparatedSyntaxList<AttributeSpecSyntax>& decls, Token semi) :
        MemberSyntax(SyntaxKind::ClockingItem, attributes), direction(&direction), decls(decls), semi(semi) {
        this->direction->parent = this;
        this->decls.parent = this;
        for (auto child : this->decls)
            child->parent = this;
    }